

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit_state.cpp
# Opt level: O2

void __thiscall
duckdb::CommitState::CommitEntryDrop(CommitState *this,CatalogEntry *entry,data_ptr_t dataptr)

{
  CatalogType CVar1;
  uint uVar2;
  CatalogEntry *pCVar3;
  ulong uVar4;
  InternalException *pIVar5;
  DuckTableEntry *table_entry;
  allocator local_329;
  undefined1 local_328 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  MemoryStream source;
  string local_2d0;
  BinaryDeserializer deserializer;
  
  if ((entry->temporary == false) &&
     (pCVar3 = CatalogEntry::Parent(entry), pCVar3->temporary == false)) {
    pCVar3 = CatalogEntry::Parent(entry);
    CVar1 = pCVar3->type;
    uVar4 = (ulong)CVar1;
    uVar2 = (uint)CVar1;
    if (uVar4 < 0x35) {
      if ((0x1000003e0002a4U >> (uVar4 & 0x3f) & 1) != 0) {
        return;
      }
      if ((0xc000015aUL >> (uVar4 & 0x3f) & 1) != 0) {
        if ((entry->type != RENAMED_ENTRY) && (entry->type != CVar1)) {
          if ((uVar2 < 0x20) && ((0xc000015aU >> (uVar2 & 0x1f) & 1) != 0)) {
            return;
          }
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&deserializer,"Don\'t know how to create this type!",
                     (allocator *)&source);
          InternalException::InternalException(pIVar5,(string *)&deserializer);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        MemoryStream::MemoryStream(&source,dataptr + 8,*(idx_t *)dataptr);
        BinaryDeserializer::BinaryDeserializer(&deserializer,&source.super_ReadStream);
        BinaryDeserializer::OnObjectBegin(&deserializer);
        Deserializer::ReadProperty<std::__cxx11::string>
                  (&column_name,&deserializer.super_Deserializer,100,"column_name");
        Deserializer::
        ReadProperty<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
                  ((Deserializer *)local_328,(field_id_t)&deserializer,(char *)0x65);
        BinaryDeserializer::OnObjectEnd(&deserializer);
        CVar1 = pCVar3->type;
        if (CVar1 < 0x20) {
          if ((0xc0000158U >> (CVar1 & 0x1f) & 1) == 0) {
            if (CVar1 != TABLE_ENTRY) goto LAB_015a62b7;
            if (column_name._M_string_length != 0) {
              DuckTableEntry::CommitAlter((DuckTableEntry *)entry,&column_name);
            }
          }
          if (local_328 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_328 + 8))();
          }
          ::std::__cxx11::string::~string((string *)&column_name);
          Deserializer::~Deserializer(&deserializer.super_Deserializer);
          MemoryStream::~MemoryStream(&source);
          return;
        }
LAB_015a62b7:
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2d0,"Don\'t know how to alter this type!",&local_329);
        InternalException::InternalException(pIVar5,&local_2d0);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (uVar4 == 0x33) {
        if (entry->type == INDEX_ENTRY) {
          DuckIndexEntry::CommitDrop((DuckIndexEntry *)entry);
          return;
        }
        if (entry->type != TABLE_ENTRY) {
          return;
        }
        DuckTableEntry::CommitDrop((DuckTableEntry *)entry);
        return;
      }
    }
    if ((0x1d < uVar2 - 0x47) || ((0x20000007U >> (uVar2 - 0x47 & 0x1f) & 1) == 0)) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&deserializer,
                 "UndoBuffer - don\'t know how to write this entry to the WAL",(allocator *)&source)
      ;
      InternalException::InternalException(pIVar5,(string *)&deserializer);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void CommitState::CommitEntryDrop(CatalogEntry &entry, data_ptr_t dataptr) {
	if (entry.temporary || entry.Parent().temporary) {
		return;
	}

	// look at the type of the parent entry
	auto &parent = entry.Parent();

	switch (parent.type) {
	case CatalogType::TABLE_ENTRY:
	case CatalogType::VIEW_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::TYPE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == parent.type) {
			// ALTER statement, read the extra data after the entry
			auto extra_data_size = Load<idx_t>(dataptr);
			auto extra_data = data_ptr_cast(dataptr + sizeof(idx_t));

			MemoryStream source(extra_data, extra_data_size);
			BinaryDeserializer deserializer(source);
			deserializer.Begin();
			auto column_name = deserializer.ReadProperty<string>(100, "column_name");
			auto parse_info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "alter_info");
			deserializer.End();

			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
				if (!column_name.empty()) {
					D_ASSERT(entry.type != CatalogType::RENAMED_ENTRY);
					auto &table_entry = entry.Cast<DuckTableEntry>();
					D_ASSERT(table_entry.IsDuckTable());
					// write the alter table in the log
					table_entry.CommitAlter(column_name);
				}
				break;
			case CatalogType::VIEW_ENTRY:
			case CatalogType::INDEX_ENTRY:
			case CatalogType::SEQUENCE_ENTRY:
			case CatalogType::TYPE_ENTRY:
			case CatalogType::MACRO_ENTRY:
			case CatalogType::TABLE_MACRO_ENTRY:
				(void)column_name;
				break;
			default:
				throw InternalException("Don't know how to alter this type!");
			}
		} else {
			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
			case CatalogType::VIEW_ENTRY:
			case CatalogType::INDEX_ENTRY:
			case CatalogType::SEQUENCE_ENTRY:
			case CatalogType::TYPE_ENTRY:
			case CatalogType::MACRO_ENTRY:
			case CatalogType::TABLE_MACRO_ENTRY:
				break;
			default:
				throw InternalException("Don't know how to create this type!");
			}
		}
		break;
	case CatalogType::SCHEMA_ENTRY:
		break;
	case CatalogType::RENAMED_ENTRY:
		// This is a rename, nothing needs to be done for this
		break;
	case CatalogType::DELETED_ENTRY:
		switch (entry.type) {
		case CatalogType::TABLE_ENTRY: {
			auto &table_entry = entry.Cast<DuckTableEntry>();
			D_ASSERT(table_entry.IsDuckTable());

			// If the table was renamed, we do not need to drop the DataTable.
			table_entry.CommitDrop();
			break;
		}
		case CatalogType::INDEX_ENTRY: {
			auto &index_entry = entry.Cast<DuckIndexEntry>();
			index_entry.CommitDrop();
			break;
		}
		default:
			// no action required
			break;
		}
		break;
	case CatalogType::DATABASE_ENTRY:
	case CatalogType::PREPARED_STATEMENT:
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
	case CatalogType::SCALAR_FUNCTION_ENTRY:
	case CatalogType::TABLE_FUNCTION_ENTRY:
	case CatalogType::COPY_FUNCTION_ENTRY:
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
	case CatalogType::COLLATION_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
	case CatalogType::SECRET_ENTRY:
	case CatalogType::SECRET_TYPE_ENTRY:
	case CatalogType::SECRET_FUNCTION_ENTRY:
		// do nothing, these entries are not persisted to disk
		break;
	default:
		throw InternalException("UndoBuffer - don't know how to write this entry to the WAL");
	}
}